

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph *self,int new_size,ImFontGlyph v)

{
  undefined8 *puVar1;
  ImFontGlyph *pIVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = self->Capacity;
  if (iVar5 < new_size) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= new_size) {
      iVar5 = new_size;
    }
    pIVar2 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar5 * 0x28);
    if (self->Data != (ImFontGlyph *)0x0) {
      memcpy(pIVar2,self->Data,(long)self->Size * 0x28);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar2;
    self->Capacity = iVar5;
  }
  iVar5 = self->Size;
  if (iVar5 < new_size) {
    lVar3 = (long)new_size - (long)iVar5;
    lVar4 = (long)iVar5 * 0x28;
    do {
      pIVar2 = self->Data;
      *(undefined8 *)((long)&pIVar2->U1 + lVar4) = v._32_8_;
      puVar1 = (undefined8 *)((long)&pIVar2->X1 + lVar4);
      *puVar1 = v._16_8_;
      puVar1[1] = v._24_8_;
      puVar1 = (undefined8 *)((long)&pIVar2->Codepoint + lVar4);
      *puVar1 = v._0_8_;
      puVar1[1] = v._8_8_;
      lVar4 = lVar4 + 0x28;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph* self,int new_size,const ImFontGlyph v)
{
    return self->resize(new_size,v);
}